

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::BuildWrapMesh(TPZMHMeshControl *this,int dim)

{
  uint uVar1;
  TPZGeoMesh *pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TPZGeoEl *pTVar6;
  ostream *poVar7;
  long lVar8;
  int64_t el;
  long iel;
  int64_t iVar9;
  int iVar10;
  TPZGeoElSide gelside_1;
  TPZAutoPointer<TPZGeoMesh> local_4e0;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide local_4c0;
  TPZGeoElSide local_4a8;
  TPZGeoElSide local_490;
  TPZGeoElSide local_478;
  TPZGeoElSide local_460;
  TPZGeoElSide local_448;
  TPZGeoElSide gelside;
  TPZGeoElSide neighbour;
  
  lVar8 = (((this->fGMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.
          fNElements;
  iVar3 = dim + -1;
  iVar9 = 0;
  if (lVar8 < 1) {
    lVar8 = iVar9;
  }
  for (; iVar9 != lVar8; iVar9 = iVar9 + 1) {
    pTVar6 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,iVar9);
    if ((pTVar6 != (TPZGeoEl *)0x0) &&
       (iVar4 = (**(code **)(*(long *)pTVar6 + 0x210))(), iVar4 == dim)) {
      iVar4 = (**(code **)(*(long *)pTVar6 + 0xf0))();
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (iVar10 = 0; iVar10 != iVar4; iVar10 = iVar10 + 1) {
        iVar5 = (**(code **)(*(long *)pTVar6 + 0x208))(pTVar6,iVar10);
        if (iVar5 == iVar3) {
          gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          gelside.fGeoEl = pTVar6;
          gelside.fSide = iVar10;
          TPZGeoElSide::Neighbour(&neighbour,&gelside);
          while ((neighbour.fGeoEl != gelside.fGeoEl || (neighbour.fSide != gelside.fSide))) {
            if ((neighbour.fGeoEl)->fMatId == this->fBoundaryWrapMatId) {
              local_448.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_0172da80;
              local_448.fSide = gelside.fSide;
              local_448.fGeoEl = gelside.fGeoEl;
              iVar5 = HasWrapNeighbour(this,&local_448);
              if (iVar5 != this->fBoundaryWrapMatId && iVar5 != 0) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                           ,0x8d7);
              }
              local_460.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_0172da80;
              local_460.fSide = gelside.fSide;
              local_460.fGeoEl = gelside.fGeoEl;
              CreateWrap(this,&local_460,this->fBoundaryWrapMatId);
            }
            TPZGeoElSide::Neighbour(&gelside_1,&neighbour);
            neighbour.fGeoEl = gelside_1.fGeoEl;
            neighbour.fSide = gelside_1.fSide;
          }
        }
      }
    }
  }
  iVar9 = 0;
  do {
    if (iVar9 == lVar8) {
      for (iel = 0; iel != lVar8; iel = iel + 1) {
        pTVar6 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,iel);
        if ((pTVar6 != (TPZGeoEl *)0x0) &&
           (iVar4 = (**(code **)(*(long *)pTVar6 + 0x210))(pTVar6), iVar4 == dim)) {
          iVar4 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
          iVar10 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar10;
          }
          for (; iVar4 != iVar10; iVar10 = iVar10 + 1) {
            iVar5 = (**(code **)(*(long *)pTVar6 + 0x208))(pTVar6,iVar10);
            if (iVar5 == iVar3) {
              local_4a8.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_0172da80;
              local_4a8.fGeoEl = pTVar6;
              local_4a8.fSide = iVar10;
              iVar5 = HasWrapNeighbour(this,&local_4a8);
              if (iVar5 == 0) {
                local_4c0.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_0172da80;
                local_4c0.fGeoEl = pTVar6;
                local_4c0.fSide = iVar10;
                CreateWrap(this,&local_4c0);
              }
            }
          }
        }
      }
      return;
    }
    pTVar6 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,iVar9);
    if ((pTVar6 != (TPZGeoEl *)0x0) &&
       (iVar4 = (**(code **)(*(long *)pTVar6 + 0x210))(), iVar4 == dim)) {
      iVar4 = (**(code **)(*(long *)pTVar6 + 0xf0))();
      iVar10 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar10 != iVar4; iVar10 = iVar10 + 1) {
        iVar5 = (**(code **)(*(long *)pTVar6 + 0x208))();
        if (iVar5 == iVar3) {
          gelside_1.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          gelside_1.fGeoEl = pTVar6;
          gelside_1.fSide = iVar10;
          TPZGeoElSide::Neighbour(&neighbour_1,&gelside_1);
          while ((neighbour_1.fGeoEl != gelside_1.fGeoEl || (neighbour_1.fSide != gelside_1.fSide)))
          {
            uVar1 = (neighbour_1.fGeoEl)->fMatId;
            iVar5 = (*this->_vptr_TPZMHMeshControl[9])(this,(ulong)uVar1);
            if ((char)iVar5 != '\0') {
              local_478.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_0172da80;
              local_478.fSide = gelside_1.fSide;
              local_478.fGeoEl = gelside_1.fGeoEl;
              iVar5 = HasWrapNeighbour(this,&local_478);
              if (((iVar5 != 0) && (iVar5 != this->fSkeletonWrapMatId)) &&
                 (iVar5 != this->fBoundaryWrapMatId)) {
                poVar7 = std::operator<<((ostream *)&std::cout,"neighbour is skeleton with matid ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar1);
                poVar7 = std::operator<<(poVar7," but the element has a wrap neighbour with matid ")
                ;
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                std::endl<char,std::char_traits<char>>(poVar7);
                TPZGeoElSide::Print(&gelside_1,(ostream *)&std::cout);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                (**(code **)(*(long *)gelside_1.fGeoEl + 0x1a0))(gelside_1.fGeoEl,&std::cout);
                std::ofstream::ofstream(&gelside,"gmesh.txt",_S_out);
                pTVar2 = ((this->fGMesh).fRef)->fPointer;
                (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[9])(pTVar2,&gelside);
                std::ofstream::ofstream(&neighbour,"gmesh.vtk",_S_out);
                local_4e0.fRef = (this->fGMesh).fRef;
                LOCK();
                ((local_4e0.fRef)->fCounter).super___atomic_base<int>._M_i =
                     ((local_4e0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
                UNLOCK();
                TPZVTKGeoMesh::PrintGMeshVTK(&local_4e0,(ofstream *)&neighbour,true,false);
                TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(&local_4e0);
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                           ,0x8fd);
              }
              if (iVar5 == 0) {
                local_490.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_0172da80;
                local_490.fSide = neighbour_1.fSide;
                local_490.fGeoEl = neighbour_1.fGeoEl;
                CreateWrap(this,&local_490,this->fSkeletonWrapMatId);
              }
            }
            TPZGeoElSide::Neighbour(&gelside,&neighbour_1);
            neighbour_1.fGeoEl = gelside.fGeoEl;
            neighbour_1.fSide = gelside.fSide;
          }
        }
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void TPZMHMeshControl::BuildWrapMesh(int dim)
{
    // all the elements should be neighbour of a wrap element
    int64_t nel = fGMesh->NElements();
  
//    int meshdim = fGMesh->Dimension();
// first create the neighbours of boundary elements (works for dim = fGMesh->Dimension()-2)
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->MaterialId() == fBoundaryWrapMatId) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fBoundaryWrapMatId) {
                        DebugStop();
                    }
                    else
                    {
                        CreateWrap(gelside,fBoundaryWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    // create the wrap elements around the skeleton elements
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                int neighmatid = neighbour.Element()->MaterialId();
                if (IsSkeletonMatid(neighmatid)) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fSkeletonWrapMatId && wrapmat != fBoundaryWrapMatId) {
                        std::cout << "neighbour is skeleton with matid " << neighmatid <<
                        " but the element has a wrap neighbour with matid " << wrapmat << std::endl;
                        gelside.Print(std::cout);
                        std::cout << std::endl;
                        gelside.Element()->Print(std::cout);
                        std::ofstream out("gmesh.txt");
                        fGMesh->Print(out);
                        std::ofstream outvtk("gmesh.vtk");
                        TPZVTKGeoMesh::PrintGMeshVTK(fGMesh,outvtk);
                        DebugStop();
                    }
                    else if(!wrapmat)
                    {
                        CreateWrap(neighbour,fSkeletonWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            if (!HasWrapNeighbour(gelside)) {
                CreateWrap(gelside);
            }
        }
    }
}